

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O2

atomic_counter_t * __thiscall zmq::msg_t::refcnt(msg_t *this)

{
  uchar uVar1;
  atomic_counter_t *paVar2;
  
  uVar1 = (this->_u).base.type;
  if ((uVar1 == 'i') || (uVar1 == 'f')) {
    paVar2 = &((this->_u).lmsg.content)->refcnt;
  }
  else {
    paVar2 = (atomic_counter_t *)0x0;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","false",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x2d2);
    fflush(_stderr);
    zmq_abort("false");
  }
  return paVar2;
}

Assistant:

zmq::atomic_counter_t *zmq::msg_t::refcnt ()
{
    switch (_u.base.type) {
        case type_lmsg:
            return &_u.lmsg.content->refcnt;
        case type_zclmsg:
            return &_u.zclmsg.content->refcnt;
        default:
            zmq_assert (false);
            return NULL;
    }
}